

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_alloc.c
# Opt level: O0

void dw_empty_errlist_item(Dwarf_Error e_in)

{
  Dwarf_Error m;
  void *mallocaddr;
  Dwarf_Error e;
  uint i;
  Dwarf_Error e_in_local;
  
  e._4_4_ = 0;
  if (e_in != (Dwarf_Error)0x0) {
    for (; e._4_4_ < static_used; e._4_4_ = e._4_4_ + 1) {
      m = staticerrlist[e._4_4_];
      if (m == e_in) {
        if (m->er_static_alloc == 2) {
          if (m < (Dwarf_Error)0x11) goto LAB_002c6b72;
          _dwarf_error_destructor(m);
          free(&m[-1].er_msg);
        }
        staticerrlist[e._4_4_] = (Dwarf_Error)0x0;
      }
LAB_002c6b72:
    }
  }
  return;
}

Assistant:

static void
dw_empty_errlist_item(Dwarf_Error e_in)
{
    unsigned i = 0;
    if (!e_in) {
        return;
    }
    for ( ; i <static_used; ++i) {
        Dwarf_Error e = staticerrlist[i];
        if (e != e_in) {
            continue;
        }
        if (e->er_static_alloc == DE_MALLOC) {
            /* e is the returned address, not
                the base. Free by the base.  */
            void *mallocaddr = 0;

            if ( (uintptr_t)e > DW_RESERVE) {
                mallocaddr = (char*)e - DW_RESERVE;
            } else {
                /*  Impossible */
                continue;
            }
            _dwarf_error_destructor(e);
            free(mallocaddr);
        }
        staticerrlist[i] = 0;
    }
}